

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsNatural(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int *__s;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  long lVar12;
  int Fill;
  uint uVar13;
  ulong extraout_RDX;
  ulong uVar14;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong local_70;
  ulong local_60;
  ulong local_58;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x115,"Vec_Ptr_t *Abc_NtkDfsNatural(Abc_Ntk_t *)");
  }
  uVar13 = pNtk->nObjs;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  local_60 = 8;
  if (6 < uVar13 - 1) {
    local_60 = (ulong)uVar13;
  }
  pVVar7->nSize = 0;
  iVar11 = (int)local_60;
  pVVar7->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar7->pArray = ppvVar8;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar15 = (long)iVar1 + 500;
    iVar16 = (int)uVar15;
    if ((pNtk->vTravIds).nCap < iVar16) {
      __s = (int *)malloc(uVar15 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar16;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar15 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar16;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar2 = pAVar9->pNtk;
  iVar1 = pAVar9->Id;
  iVar16 = pAVar2->nTravIds;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Fill);
  if ((-1 < (long)iVar1) && (iVar1 < (pAVar2->vTravIds).nSize)) {
    (pAVar2->vTravIds).pArray[iVar1] = iVar16;
    if (iVar11 == 0) {
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x80);
      }
      pVVar7->pArray = ppvVar8;
      pVVar7->nCap = 0x10;
      local_60 = 0x10;
    }
    pVVar7->nSize = 1;
    *ppvVar8 = pAVar9;
    pVVar10 = pNtk->vObjs;
    if (0 < pVVar10->nSize) {
      uVar13 = 1;
      uVar15 = 0;
      local_70 = local_60;
      local_58 = local_70;
      do {
        plVar3 = (long *)pVVar10->pArray[uVar15];
        if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
          uVar14 = uVar15;
          if (0 < *(int *)((long)plVar3 + 0x1c)) {
            lVar17 = 0;
            do {
              plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)(plVar3[4] + lVar17 * 4) * 8);
              uVar6 = *(uint *)((long)plVar4 + 0x14) & 0xf;
              if ((uVar6 == 5) || (uVar6 == 2)) {
                lVar12 = *plVar4;
                iVar11 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar11 + 1,(int)uVar14);
                if (((long)iVar11 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar11)) goto LAB_002ea1f2;
                lVar5 = *plVar4;
                iVar1 = *(int *)(lVar5 + 0xd8);
                uVar14 = extraout_RDX;
                if (*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar11 * 4) != iVar1) {
                  iVar11 = (int)plVar4[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar11 + 1,(int)extraout_RDX);
                  if (((long)iVar11 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar11)) goto LAB_002ea211;
                  *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar11 * 4) = iVar1;
                  uVar6 = (uint)local_58;
                  if (uVar13 == uVar6) {
                    if ((int)uVar6 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      pVVar7->nCap = 0x10;
                      local_60 = 0x10;
                      local_70 = 0x10;
                      local_58 = 0x10;
                    }
                    else {
                      local_70 = (ulong)(uVar6 * 2);
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(local_70 * 8);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,local_70 * 8);
                      }
                      pVVar7->pArray = ppvVar8;
                      pVVar7->nCap = uVar6 * 2;
                      local_60 = local_70;
                      local_58 = local_70;
                    }
                  }
                  else {
                    ppvVar8 = pVVar7->pArray;
                  }
                  lVar12 = (long)(int)uVar13;
                  uVar13 = uVar13 + 1;
                  uVar14 = (ulong)uVar13;
                  pVVar7->nSize = uVar13;
                  ppvVar8[lVar12] = plVar4;
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < *(int *)((long)plVar3 + 0x1c));
          }
          uVar6 = (uint)local_70;
          if (uVar13 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
                uVar14 = extraout_RDX_02;
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                uVar14 = extraout_RDX_00;
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
              local_60 = 0x10;
              local_70 = 0x10;
            }
            else {
              local_60 = (ulong)(uVar6 * 2);
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(local_60 * 8);
                uVar14 = extraout_RDX_03;
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,local_60 * 8);
                uVar14 = extraout_RDX_01;
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = uVar6 * 2;
              local_70 = local_60;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          uVar6 = uVar13 + 1;
          pVVar7->nSize = uVar6;
          ppvVar8[(int)uVar13] = plVar3;
          uVar13 = uVar6;
          if (*(int *)((long)plVar3 + 0x2c) < 1) {
            local_58 = local_70;
          }
          else {
            local_58 = local_70;
            lVar17 = 0;
            do {
              plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                 (long)*(int *)(plVar3[6] + lVar17 * 4) * 8);
              if (0xfffffffd < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 5) {
                lVar12 = *plVar4;
                iVar11 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar11 + 1,(int)uVar14);
                if (((long)iVar11 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar11)) {
LAB_002ea1f2:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                lVar5 = *plVar4;
                iVar1 = *(int *)(lVar5 + 0xd8);
                uVar14 = extraout_RDX_04;
                if (*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar11 * 4) != iVar1) {
                  iVar11 = (int)plVar4[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar11 + 1,(int)extraout_RDX_04);
                  if (((long)iVar11 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar11)) goto LAB_002ea211;
                  *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar11 * 4) = iVar1;
                  uVar6 = (uint)local_60;
                  if (uVar13 == uVar6) {
                    if ((int)uVar6 < 0x10) {
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                      }
                      pVVar7->pArray = ppvVar8;
                      pVVar7->nCap = 0x10;
                      local_60 = 0x10;
                    }
                    else {
                      local_60 = (ulong)(uVar6 * 2);
                      if (pVVar7->pArray == (void **)0x0) {
                        ppvVar8 = (void **)malloc(local_60 * 8);
                      }
                      else {
                        ppvVar8 = (void **)realloc(pVVar7->pArray,local_60 * 8);
                      }
                      pVVar7->pArray = ppvVar8;
                      pVVar7->nCap = uVar6 * 2;
                    }
                  }
                  else {
                    ppvVar8 = pVVar7->pArray;
                  }
                  lVar12 = (long)(int)uVar13;
                  uVar13 = uVar13 + 1;
                  uVar14 = (ulong)uVar13;
                  pVVar7->nSize = uVar13;
                  ppvVar8[lVar12] = plVar4;
                  local_70 = local_60;
                  local_58 = local_60;
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < *(int *)((long)plVar3 + 0x2c));
          }
        }
        uVar15 = uVar15 + 1;
        pVVar10 = pNtk->vObjs;
      } while ((long)uVar15 < (long)pVVar10->nSize);
    }
    return pVVar7;
  }
LAB_002ea211:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsNatural( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    // add the constant-1 nodes
    pObj = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent( pObj );
    Vec_PtrPush( vNodes, pObj );
    // add the CIs/nodes/COs in the topological order
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check the fanins and add CIs
        Abc_ObjForEachFanin( pObj, pNext, k )
            if ( Abc_ObjIsCi(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
        // add the node
        Vec_PtrPush( vNodes, pObj );
        // check the fanouts and add COs
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( Abc_ObjIsCo(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
    }
    return vNodes;
}